

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fct_xchk2_fn(char *condition,int is_pass,char *format,...)

{
  size_t sVar1;
  char *src;
  char in_AL;
  int iVar2;
  int extraout_EAX;
  char *dst;
  undefined8 extraout_RAX;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 in_RCX;
  fct_test_t *list;
  undefined8 in_R8;
  undefined8 in_R9;
  fct_nlist_t *list_00;
  size_t idx;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  src = fct_xchk_file;
  args[0].reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x18;
  args[0].fp_offset = 0x30;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (condition == (char *)0x0) {
    __assert_fail("cndtn != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x36b
                  ,
                  "fctchk_t *fctchk_new(int, const char *, const char *, int, const char *, __va_list_tag *)"
                 );
  }
  if (fct_xchk_file == (char *)0x0) {
    __assert_fail("file != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x36c
                  ,
                  "fctchk_t *fctchk_new(int, const char *, const char *, int, const char *, __va_list_tag *)"
                 );
  }
  if ((fct_xchk_lineno & 1) != 0) {
    dst = (char *)calloc(1,0x308);
    if (dst == (char *)0x0) {
      fctkern__log_warn(fct_xchk_kern,"out of memory (aborting test)");
      iVar2 = extraout_EAX;
    }
    else {
      fctstr_safe_cpy(dst,condition,0x100);
      fctstr_safe_cpy(dst + 0x100,src,0x100);
      dst[0x200] = '\x1c';
      dst[0x201] = '\0';
      dst[0x202] = '\0';
      dst[0x203] = '\0';
      dst[0x204] = '\x01';
      dst[0x205] = '\0';
      dst[0x206] = '\0';
      dst[0x207] = '\0';
      vsnprintf(dst + 0x208,0x100,"always succeed",args);
      if (fct_xchk_test == (fct_test_t *)0x0) {
        __assert_fail("test != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x40a,"void fct_test__add(fct_test_t *, fctchk_t *)");
      }
      list = (fct_test_t *)&fct_xchk_test->passed_chks;
      if (*(int *)(dst + 0x204) == 0) {
        list = fct_xchk_test;
      }
      fct_nlist__append(&list->failed_chks,dst);
      if (fct_xchk_kern == (fctkern_t *)0x0) {
        __assert_fail("nk != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x94b,"void fctkern__log_chk(fctkern_t *, const fctchk_t *)");
      }
      sVar1 = (fct_xchk_kern->logger_list).used_itm_num;
      list_00 = &fct_xchk_kern->logger_list;
      uVar4 = extraout_RAX;
      for (idx = 0; iVar2 = (int)uVar4, sVar1 != idx; idx = idx + 1) {
        puVar3 = (undefined8 *)fct_nlist__at(list_00,idx);
        puVar3[0xc] = dst;
        uVar4 = (*(code *)*puVar3)(puVar3,puVar3 + 0xb);
      }
    }
    fct_xchk_file = (char *)0x0;
    fct_xchk_test = (fct_test_t *)0x0;
    fct_xchk_lineno = 0;
    fct_xchk_kern = (fctkern_t *)0x0;
    return iVar2;
  }
  __assert_fail("lineno > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x36d,
                "fctchk_t *fctchk_new(int, const char *, const char *, int, const char *, __va_list_tag *)"
               );
}

Assistant:

static int
fct_xchk2_fn(const char *condition, int is_pass, char const *format, ...)
{
    int r =0;
    va_list args;
    va_start(args, format);
    r = _fct_xchk_fn_varg(condition, is_pass, format, args);
    va_end(args);
    return r;
}